

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O0

Checker * __thiscall
deqp::gles3::Functional::ES3CheckerFactory::createChecker
          (ES3CheckerFactory *this,RenderContext *ctx)

{
  ES3Checker *this_00;
  RenderContext *ctx_local;
  ES3CheckerFactory *this_local;
  
  this_00 = (ES3Checker *)operator_new(0x58);
  ES3Checker::ES3Checker(this_00,ctx);
  return &this_00->super_Checker;
}

Assistant:

Checker*			createChecker	(const glu::RenderContext& ctx) { return new ES3Checker(ctx); }